

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O3

void PHYSFS_utf8FromUtf16(PHYSFS_uint16 *src,char *dst,PHYSFS_uint64 len)

{
  ushort uVar1;
  ushort uVar2;
  PHYSFS_uint32 cp;
  PHYSFS_uint32 PVar3;
  ushort *puVar4;
  PHYSFS_uint64 local_28;
  char *local_20;
  
  if (len != 0) {
    local_28 = len - 1;
    if (local_28 != 0) {
      local_20 = dst;
      do {
        uVar1 = *src;
        PVar3 = (PHYSFS_uint32)uVar1;
        dst = local_20;
        if (uVar1 == 0) break;
        puVar4 = src + 1;
        cp = 0x3f;
        if ((uVar1 & 0xfc00) != 0xdc00) {
          if ((uVar1 & 0xfc00) == 0xd800) {
            uVar2 = *puVar4;
            if ((ushort)(uVar2 + 0x2000) < 0xfc00) goto LAB_0010b065;
            puVar4 = src + 2;
            PVar3 = (uint)uVar1 * 0x400 + (uint)uVar2 + 0xfc9f2400;
          }
          cp = PVar3;
          if (PVar3 == 0) break;
        }
LAB_0010b065:
        src = puVar4;
        utf8fromcodepoint(cp,&local_20,&local_28);
        dst = local_20;
      } while (local_28 != 0);
    }
    *dst = '\0';
  }
  return;
}

Assistant:

void PHYSFS_utf8FromUtf16(const PHYSFS_uint16 *src, char *dst, PHYSFS_uint64 len)
{
    if (len == 0)
        return;

    len--;
    while (len)
    {
        const PHYSFS_uint32 cp = utf16codepoint(&src);
        if (!cp)
            break;
        utf8fromcodepoint(cp, &dst, &len);
    } /* while */

    *dst = '\0';
}